

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

void __thiscall c4::yml::Tree::set_root_as_stream(Tree *this)

{
  code *pcVar1;
  Location loc;
  Location loc_00;
  Location loc_01;
  Location loc_02;
  Location loc_03;
  Location loc_04;
  bool bVar2;
  error_flags eVar3;
  NodeData *pNVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  size_t in_RDI;
  size_t next;
  size_t ch;
  size_t prev;
  size_t next_doc;
  char msg [31];
  size_t next_doc_1;
  size_t root;
  size_t in_stack_000001a8;
  size_t in_stack_000001b0;
  size_t child;
  Tree *in_stack_000001c0;
  size_t child_1;
  size_t in_stack_fffffffffffffce8;
  Tree *in_stack_fffffffffffffcf0;
  char *in_stack_fffffffffffffcf8;
  Location *in_stack_fffffffffffffd00;
  Tree *in_stack_fffffffffffffd08;
  Location *in_stack_fffffffffffffd10;
  Tree *pTVar8;
  Tree *this_00;
  size_t in_stack_fffffffffffffd38;
  Tree *in_stack_fffffffffffffd40;
  undefined8 in_stack_fffffffffffffd58;
  NodeType_e NVar9;
  undefined8 in_stack_fffffffffffffd60;
  undefined8 in_stack_fffffffffffffd68;
  size_t in_stack_fffffffffffffd70;
  undefined4 local_280;
  undefined4 uStack_27c;
  undefined4 uStack_278;
  undefined4 uStack_274;
  undefined4 local_270;
  undefined4 uStack_26c;
  undefined4 uStack_268;
  undefined4 uStack_264;
  Tree *local_260;
  char local_258 [32];
  NodeType local_238;
  size_t local_230;
  Tree *local_228;
  Tree *local_218;
  Tree *local_208;
  undefined8 local_1f8;
  NodeData *local_1f0;
  undefined8 local_1e8;
  NodeData *local_1e0;
  Tree *local_1d8;
  Tree *local_1c8;
  undefined8 local_1b8;
  NodeData *local_1b0;
  undefined8 local_1a8;
  NodeType *local_1a0;
  undefined8 local_198;
  undefined1 *local_190;
  Tree *local_188;
  NodeData *local_178;
  NodeData *local_170;
  NodeData *local_168;
  size_t local_160;
  size_t local_158;
  Tree *pTStack_150;
  Tree *in_stack_fffffffffffffec0;
  size_t local_130;
  Tree *pTStack_128;
  char *local_120;
  Location *pLStack_118;
  size_t local_108;
  Tree *pTStack_100;
  char *local_f8;
  Location *pLStack_f0;
  size_t local_b0;
  Tree *in_stack_ffffffffffffff58;
  size_t in_stack_ffffffffffffff60;
  size_t in_stack_ffffffffffffff68;
  Tree *in_stack_ffffffffffffff70;
  size_t local_88;
  Tree *pTStack_80;
  char *local_78;
  Location *pLStack_70;
  Tree *local_68;
  size_t local_60;
  Tree *pTStack_58;
  char *local_50;
  Location *pLStack_48;
  Tree *local_40;
  
  local_228 = (Tree *)root_id(in_stack_fffffffffffffd40);
  local_218 = local_228;
  local_168 = _p(in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
  if (((local_168->m_type).type & STREAM) != STREAM) {
    bVar2 = has_children(in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
    if (bVar2) {
      local_188 = local_228;
      local_170 = _p(in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
      if (((local_170->m_type).type & KEY) != NOTYPE) {
        builtin_strncpy(local_258,"check failed: (!has_key(root))",0x1f);
        eVar3 = get_error_flags();
        if (((eVar3 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
          trap_instruction();
        }
        pcVar1 = *(code **)(in_RDI + 0x58);
        Location::Location(in_stack_fffffffffffffd10,(char *)in_stack_fffffffffffffd08,
                           (size_t)in_stack_fffffffffffffd00,(size_t)in_stack_fffffffffffffcf8,
                           (size_t)in_stack_fffffffffffffcf0);
        in_stack_fffffffffffffcf8 = (char *)CONCAT44(uStack_26c,local_270);
        in_stack_fffffffffffffd00 = (Location *)CONCAT44(uStack_264,uStack_268);
        in_stack_fffffffffffffce8 = CONCAT44(uStack_27c,local_280);
        in_stack_fffffffffffffcf0 = (Tree *)CONCAT44(uStack_274,uStack_278);
        (*pcVar1)(local_258,0x1f,*(undefined8 *)(in_RDI + 0x40));
        in_stack_fffffffffffffd08 = local_260;
      }
      local_1d8 = local_228;
      pTVar8 = local_228;
      sVar5 = in_RDI;
      pNVar4 = _p(in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
      sVar6 = pNVar4->m_last_child;
      this_00 = pTVar8;
      if (pTVar8 == (Tree *)0xffffffffffffffff) {
        eVar3 = get_error_flags();
        if (((eVar3 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
          trap_instruction();
        }
        Location::Location(in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,
                           (size_t)in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
        loc_02.super_LineCol.line = in_stack_fffffffffffffd58;
        loc_02.super_LineCol.offset = sVar5;
        loc_02.super_LineCol.col = in_stack_fffffffffffffd60;
        loc_02.name.str = (char *)in_stack_fffffffffffffd68;
        loc_02.name.len = in_stack_fffffffffffffd70;
        error<29ul>((char (*) [29])in_stack_fffffffffffffd40,loc_02);
        in_stack_fffffffffffffce8 = local_60;
        in_stack_fffffffffffffcf0 = pTStack_58;
        in_stack_fffffffffffffcf8 = local_50;
        in_stack_fffffffffffffd00 = pLStack_48;
        in_stack_fffffffffffffd08 = local_40;
      }
      pNVar4 = _p(in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
      if ((((pNVar4->m_type).type & (STREAM|MAP)) == NOTYPE) &&
         (bVar2 = is_root(in_stack_fffffffffffffd40,in_stack_fffffffffffffd38), !bVar2)) {
        eVar3 = get_error_flags();
        if (((eVar3 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
          trap_instruction();
        }
        Location::Location(in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,
                           (size_t)in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
        loc_03.super_LineCol.line = in_stack_fffffffffffffd58;
        loc_03.super_LineCol.offset = sVar5;
        loc_03.super_LineCol.col = in_stack_fffffffffffffd60;
        loc_03.name.str = (char *)in_stack_fffffffffffffd68;
        loc_03.name.len = in_stack_fffffffffffffd70;
        error<54ul>((char (*) [54])in_stack_fffffffffffffd40,loc_03);
        in_stack_fffffffffffffce8 = local_88;
        in_stack_fffffffffffffcf0 = pTStack_80;
        in_stack_fffffffffffffcf8 = local_78;
        in_stack_fffffffffffffd00 = pLStack_70;
        in_stack_fffffffffffffd08 = local_68;
      }
      if ((sVar6 != 0xffffffffffffffff) &&
         (pNVar4 = _p(in_stack_fffffffffffffd40,in_stack_fffffffffffffd38),
         (Tree *)pNVar4->m_parent != pTVar8)) {
        eVar3 = get_error_flags();
        in_stack_fffffffffffffd08 = in_stack_ffffffffffffff70;
        if (((eVar3 & 1) != 0) &&
           (bVar2 = is_debugger_attached(), in_stack_fffffffffffffd08 = in_stack_ffffffffffffff70,
           bVar2)) {
          trap_instruction();
          in_stack_fffffffffffffd08 = in_stack_ffffffffffffff70;
        }
        Location::Location(in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,
                           (size_t)in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
        in_stack_fffffffffffffcf0 = in_stack_ffffffffffffff58;
        loc_04.super_LineCol.line = in_stack_fffffffffffffd58;
        loc_04.super_LineCol.offset = sVar5;
        loc_04.super_LineCol.col = in_stack_fffffffffffffd60;
        loc_04.name.str = (char *)in_stack_fffffffffffffd68;
        loc_04.name.len = in_stack_fffffffffffffd70;
        in_stack_ffffffffffffff58 = in_stack_fffffffffffffcf0;
        in_stack_ffffffffffffff70 = in_stack_fffffffffffffd08;
        error<63ul>((char (*) [63])in_stack_fffffffffffffd40,loc_04);
        in_stack_fffffffffffffce8 = local_b0;
      }
      sVar5 = _claim(in_stack_fffffffffffffec0);
      _set_hierarchy(in_stack_000001c0,child,in_stack_000001b0,in_stack_000001a8);
      _copy_props_wo_key(in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8,0x2e5a89);
      _add_flags(this_00,in_RDI,(NodeType_e)in_stack_fffffffffffffd08);
      sVar6 = first_child(in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
      sVar7 = next_sibling(in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
      while ((sVar6 != 0xffffffffffffffff && (sVar6 != sVar5))) {
        move(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
             (size_t)in_stack_ffffffffffffff58);
        sVar6 = sVar7;
        sVar7 = next_sibling(in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
      }
      local_190 = &stack0xfffffffffffffd58;
      local_198 = 0x28;
      NVar9 = STREAM;
      pNVar4 = _p(in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
      (pNVar4->m_type).type = NVar9;
    }
    else {
      local_208 = local_228;
      local_178 = _p(in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
      if (((local_178->m_type).type & KEYVAL) == VAL) {
        local_1e0 = _p(in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
        in_stack_fffffffffffffd38 = in_RDI;
        local_1e8 = 8;
        (local_1e0->m_type).type = (local_1e0->m_type).type | SEQ;
        local_1c8 = local_228;
        pTVar8 = local_228;
        sVar5 = in_stack_fffffffffffffd38;
        pNVar4 = _p(local_228,in_stack_fffffffffffffd38);
        sVar6 = pNVar4->m_last_child;
        in_stack_fffffffffffffd40 = pTVar8;
        if (pTVar8 == (Tree *)0xffffffffffffffff) {
          eVar3 = get_error_flags();
          if (((eVar3 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
            trap_instruction();
          }
          Location::Location(in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,
                             (size_t)in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
          loc.super_LineCol.line = in_stack_fffffffffffffd58;
          loc.super_LineCol.offset = sVar5;
          loc.super_LineCol.col = in_stack_fffffffffffffd60;
          loc.name.str = (char *)in_stack_fffffffffffffd68;
          loc.name.len = in_stack_fffffffffffffd70;
          error<29ul>((char (*) [29])in_stack_fffffffffffffd40,loc);
          in_stack_fffffffffffffce8 = local_108;
          in_stack_fffffffffffffcf0 = pTStack_100;
          in_stack_fffffffffffffcf8 = local_f8;
          in_stack_fffffffffffffd00 = pLStack_f0;
        }
        pNVar4 = _p(in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
        if ((((pNVar4->m_type).type & (STREAM|MAP)) == NOTYPE) &&
           (bVar2 = is_root(in_stack_fffffffffffffd40,in_stack_fffffffffffffd38), !bVar2)) {
          eVar3 = get_error_flags();
          if (((eVar3 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
            trap_instruction();
          }
          Location::Location(in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,
                             (size_t)in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
          loc_00.super_LineCol.line = in_stack_fffffffffffffd58;
          loc_00.super_LineCol.offset = sVar5;
          loc_00.super_LineCol.col = in_stack_fffffffffffffd60;
          loc_00.name.str = (char *)in_stack_fffffffffffffd68;
          loc_00.name.len = in_stack_fffffffffffffd70;
          error<54ul>((char (*) [54])in_stack_fffffffffffffd40,loc_00);
          in_stack_fffffffffffffce8 = local_130;
          in_stack_fffffffffffffcf0 = pTStack_128;
          in_stack_fffffffffffffcf8 = local_120;
          in_stack_fffffffffffffd00 = pLStack_118;
        }
        if ((sVar6 != 0xffffffffffffffff) &&
           (pNVar4 = _p(in_stack_fffffffffffffd40,in_stack_fffffffffffffd38),
           (Tree *)pNVar4->m_parent != pTVar8)) {
          eVar3 = get_error_flags();
          if (((eVar3 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
            trap_instruction();
          }
          Location::Location(in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,
                             (size_t)in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
          loc_01.super_LineCol.line = in_stack_fffffffffffffd58;
          loc_01.super_LineCol.offset = sVar5;
          loc_01.super_LineCol.col = in_stack_fffffffffffffd60;
          loc_01.name.str = (char *)in_stack_fffffffffffffd68;
          loc_01.name.len = in_stack_fffffffffffffd70;
          error<63ul>((char (*) [63])in_stack_fffffffffffffd40,loc_01);
          in_stack_fffffffffffffce8 = local_158;
          in_stack_fffffffffffffcf0 = pTStack_150;
        }
        local_160 = _claim(in_stack_fffffffffffffec0);
        _set_hierarchy(in_stack_000001c0,child,in_stack_000001b0,in_stack_000001a8);
        local_230 = local_160;
        _copy_props_wo_key(in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8,0x2e55af);
        local_1f0 = _p(in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
        local_1f8 = 0x10;
        (local_1f0->m_type).type = (local_1f0->m_type).type | DOC;
        local_1b0 = _p(in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
        local_1b8 = 8;
        (local_1b0->m_type).type = (local_1b0->m_type).type & ~SEQ;
      }
      local_1a0 = &local_238;
      local_1a8 = 0x28;
      local_238.type = STREAM;
      pNVar4 = _p(in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
      (pNVar4->m_type).type = local_238.type;
    }
  }
  return;
}

Assistant:

void Tree::set_root_as_stream()
{
    size_t root = root_id();
    if(is_stream(root))
        return;
    // don't use _add_flags() because it's checked and will fail
    if(!has_children(root))
    {
        if(is_val(root))
        {
            _p(root)->m_type.add(SEQ);
            size_t next_doc = append_child(root);
            _copy_props_wo_key(next_doc, root);
            _p(next_doc)->m_type.add(DOC);
            _p(next_doc)->m_type.rem(SEQ);
        }
        _p(root)->m_type = STREAM;
        return;
    }
    _RYML_CB_ASSERT(m_callbacks, !has_key(root));
    size_t next_doc = append_child(root);
    _copy_props_wo_key(next_doc, root);
    _add_flags(next_doc, DOC);
    for(size_t prev = NONE, ch = first_child(root), next = next_sibling(ch); ch != NONE; )
    {
        if(ch == next_doc)
            break;
        move(ch, next_doc, prev);
        prev = ch;
        ch = next;
        next = next_sibling(next);
    }
    _p(root)->m_type = STREAM;
}